

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cpp
# Opt level: O0

int __thiscall
Bind::mount(Bind *this,char *__special_file,char *__dir,char *__fstype,ulong __rwflag,void *__data)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  ContextManager *pCVar3;
  value_type *pvVar4;
  value_type *pvVar5;
  undefined7 extraout_var_00;
  undefined8 uVar6;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  int local_164;
  undefined1 local_160 [4];
  int fd;
  path local_140;
  string local_118;
  path local_f8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  error_code error;
  ulong uStack_28;
  bool optional;
  unsigned_long mount_flags;
  path *work_dir_local;
  path *root_dir_local;
  Bind *this_local;
  
  set_paths(this,(path *)__special_file,(path *)__dir);
  uStack_28 = 0x5000;
  if ((this->flags_ & 1U) == 0) {
    uStack_28 = 0x5001;
  }
  if ((this->flags_ & 2U) == 0) {
    uStack_28 = uStack_28 | 4;
  }
  if ((this->flags_ & 4U) != 0) {
    uStack_28 = uStack_28 | 8;
  }
  if ((this->flags_ & 8U) == 0) {
    uStack_28 = uStack_28 | 2;
  }
  error._M_cat._7_1_ = (this->flags_ & 0x10U) != 0;
  std::error_code::error_code((error_code *)local_40);
  bVar1 = std::filesystem::exists(&this->from_,(error_code *)local_40);
  if (!bVar1) {
    if ((error._M_cat._7_1_ & 1) != 0) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
    pCVar3 = ContextManager::get();
    pvVar4 = std::filesystem::__cxx11::path::c_str(&this->from_);
    format_abi_cxx11_(&local_60,"%s not exists",pvVar4);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  bVar1 = std::filesystem::is_directory(&this->from_,(error_code *)local_40);
  if (bVar1) {
    std::filesystem::create_directories(&this->to_,(error_code *)local_40);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
    if (bVar1) {
      pCVar3 = ContextManager::get();
      pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
      std::error_code::message_abi_cxx11_(&local_b0,(error_code *)local_40);
      uVar6 = std::__cxx11::string::c_str();
      format_abi_cxx11_(&local_90,"Cannot create dir %s for mount point: %s",pvVar4,uVar6);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    pvVar4 = std::filesystem::__cxx11::path::c_str(&this->from_);
    pvVar5 = std::filesystem::__cxx11::path::c_str(&this->to_);
    iVar2 = ::mount(pvVar4,pvVar5,"none",uStack_28,"");
    if (iVar2 < 0) {
      pCVar3 = ContextManager::get();
      pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
      format_abi_cxx11_(&local_d0,"Cannot mount %s: %m",pvVar4);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    this->mounted_ = true;
  }
  else {
    bVar1 = std::filesystem::is_regular_file(&this->from_,(error_code *)local_40);
    if (bVar1) {
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::create_directories(&local_f8,(error_code *)local_40);
      std::filesystem::__cxx11::path::~path(&local_f8);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
      if (bVar1) {
        pCVar3 = ContextManager::get();
        std::filesystem::__cxx11::path::parent_path();
        pvVar4 = std::filesystem::__cxx11::path::c_str(&local_140);
        std::error_code::message_abi_cxx11_((string *)local_160,(error_code *)local_40);
        uVar6 = std::__cxx11::string::c_str();
        format_abi_cxx11_(&local_118,"Cannot create dir %s: %s",pvVar4,uVar6);
        (**pCVar3->_vptr_ContextManager)(pCVar3,&local_118);
        std::__cxx11::string::~string((string *)&local_118);
        std::__cxx11::string::~string((string *)local_160);
        std::filesystem::__cxx11::path::~path(&local_140);
      }
      pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
      local_164 = open(pvVar4,0x241);
      if (local_164 < 0) {
        pCVar3 = ContextManager::get();
        pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
        format_abi_cxx11_(&local_188,"Cannot create file %s for mount point: %m",pvVar4);
        (**pCVar3->_vptr_ContextManager)(pCVar3,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
      }
      iVar2 = close(local_164);
      if (iVar2 < 0) {
        pCVar3 = ContextManager::get();
        format_abi_cxx11_(&local_1a8,"Cannot close file desctiptor: %m");
        (**pCVar3->_vptr_ContextManager)(pCVar3,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      pvVar4 = std::filesystem::__cxx11::path::c_str(&this->from_);
      pvVar5 = std::filesystem::__cxx11::path::c_str(&this->to_);
      iVar2 = ::mount(pvVar4,pvVar5,"none",uStack_28,"");
      if (iVar2 < 0) {
        pCVar3 = ContextManager::get();
        pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
        format_abi_cxx11_(&local_1c8,"Cannot mount %s: %m",pvVar4);
        (**pCVar3->_vptr_ContextManager)(pCVar3,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
      }
      this->mounted_ = true;
    }
    else {
      pCVar3 = ContextManager::get();
      pvVar4 = std::filesystem::__cxx11::path::c_str(&this->to_);
      format_abi_cxx11_(&local_1e8,"%s is not directory nor regular file",pvVar4);
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
  }
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
  iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
  if (bVar1) {
    pCVar3 = ContextManager::get();
    pvVar4 = std::filesystem::__cxx11::path::c_str(&this->from_);
    std::error_code::message_abi_cxx11_(&local_228,(error_code *)local_40);
    uVar6 = std::__cxx11::string::c_str();
    format_abi_cxx11_(&local_208,"Cannot stat %s: %s",pvVar4,uVar6);
    (**pCVar3->_vptr_ContextManager)(pCVar3,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    iVar2 = std::__cxx11::string::~string((string *)&local_228);
  }
  return iVar2;
}

Assistant:

void Bind::mount(const fs::path &root_dir, const fs::path &work_dir) {
    set_paths(root_dir, work_dir);
    unsigned long mount_flags = (MS_BIND | MS_REC);
    if (!(flags_ & Rules::RW)) {
        mount_flags |= MS_RDONLY;
    }
    if (!(flags_ & Rules::DEV)) {
        mount_flags |= MS_NODEV;
    }
    if (flags_ & Rules::NOEXEC) {
        mount_flags |= MS_NOEXEC;
    }
    if (!(flags_ & Rules::SUID)) {
        mount_flags |= MS_NOSUID;
    }

    bool optional = (flags_ & Rules::OPT);

    std::error_code error;
    if (!fs::exists(from_, error)) {
        if (optional) return;
        die(format("%s not exists", from_.c_str()));
    }

    if (fs::is_directory(from_, error)) {
        fs::create_directories(to_, error);
        if (error) {
            die(format("Cannot create dir %s for mount point: %s", to_.c_str(), error.message().c_str()));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else if (fs::is_regular_file(from_, error)) {
        fs::create_directories(to_.parent_path(), error);
        if (error) {
            die(format("Cannot create dir %s: %s", from_.parent_path().c_str(), error.message().c_str()));
        }
        int fd = open(to_.c_str(), O_CREAT | O_WRONLY | O_TRUNC);
        if (fd < 0) {
            die(format("Cannot create file %s for mount point: %m", to_.c_str()));
        }
        if (close(fd) < 0) {
            die(format("Cannot close file desctiptor: %m"));
        }
        if (::mount(from_.c_str(), to_.c_str(), "none", mount_flags, "") < 0) {
            die(format("Cannot mount %s: %m", to_.c_str()));
        }
        mounted_ = true;
    } else {
        die(format("%s is not directory nor regular file", to_.c_str()));
    }
    if (error) {
        die(format("Cannot stat %s: %s", from_.c_str(), error.message().c_str()));
    }
}